

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KEncodersDecoders.h
# Opt level: O2

void __thiscall KDIS::NetToDataType<unsigned_short>::SwapBytes(NetToDataType<unsigned_short> *this)

{
  KUINT16 i;
  long lVar1;
  KOCTET Temp [2];
  
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    Temp[lVar1] = *(KOCTET *)((long)this + lVar1);
  }
  (this->field_0).m_Octs[0] = Temp[1];
  (this->field_0).m_Octs[1] = Temp[0];
  return;
}

Assistant:

void SwapBytes()
    {
        KOCTET Temp[sizeof( DataType )];

        // Copy Data To temp;
        for( KUINT16 i = 0; i < sizeof( DataType ); ++i )
        {
            Temp[i] = m_Octs[i];
        }

        // Now swap bytes
        KUINT16 j = ( sizeof( DataType ) ) - 1 ;

        for( KUINT16 i = 0; i < sizeof( DataType ); ++i )
        {
            m_Octs[i] = Temp[j];
            --j;
        }
    }